

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall TestValueTestzeroesInKeys::runTestCase(TestValueTestzeroesInKeys *this)

{
  TestResult *pTVar1;
  bool bVar2;
  Value *pVVar3;
  allocator local_119;
  string local_118;
  Value local_f8;
  string binary;
  Value removed;
  Value root;
  string local_60;
  Value local_40;
  
  binary._M_dataplus._M_p = (pointer)&binary.field_2;
  binary.field_2._M_allocated_capacity._0_4_ = 0x690068;
  binary._M_string_length = 4;
  binary.field_2._M_local_buf[4] = '\0';
  JsonTest::checkEqual<unsigned_int,unsigned_long>
            ((this->super_ValueTest).super_TestCase.result_,4,4,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x684,"4U == binary.length()");
  Json::Value::Value(&root,nullValue);
  Json::Value::Value(&local_40,"there");
  pVVar3 = Json::Value::operator[](&root,&binary);
  Json::Value::operator=(pVVar3,&local_40);
  Json::Value::~Value(&local_40);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  std::__cxx11::string::string((string *)&removed,"there",(allocator *)&local_118);
  pVVar3 = Json::Value::operator[](&root,&binary);
  Json::Value::asString_abi_cxx11_((string *)&local_f8,pVVar3);
  JsonTest::checkStringEqual
            (pTVar1,(string *)&removed,(string *)&local_f8,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x688,"\"there\" == root[binary].asString()");
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&removed);
  bVar2 = Json::Value::isMember(&root,"h");
  if (bVar2) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x689,"!root.isMember(\"h\")");
  }
  bVar2 = Json::Value::isMember(&root,&binary);
  if (!bVar2) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x68a,"root.isMember(binary)");
  }
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  std::__cxx11::string::string((string *)&local_f8,"there",(allocator *)&local_60);
  Json::Value::get(&removed,&root,&binary,(Value *)Json::kNull);
  Json::Value::asString_abi_cxx11_(&local_118,&removed);
  JsonTest::checkStringEqual
            (pTVar1,(string *)&local_f8,&local_118,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x68b,"\"there\" == root.get(binary, Json::Value::nullRef).asString()");
  std::__cxx11::string::~string((string *)&local_118);
  Json::Value::~Value(&removed);
  std::__cxx11::string::~string((string *)&local_f8);
  Json::Value::Value(&removed,nullValue);
  bVar2 = Json::Value::removeMember
                    (&root,binary._M_dataplus._M_p,binary._M_dataplus._M_p + binary._M_string_length
                     ,&removed);
  if (!bVar2) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x690,"did");
  }
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  std::__cxx11::string::string((string *)&local_f8,"there",(allocator *)&local_60);
  Json::Value::asString_abi_cxx11_(&local_118,&removed);
  JsonTest::checkStringEqual
            (pTVar1,(string *)&local_f8,&local_118,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x691,"\"there\" == removed.asString()");
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_f8);
  bVar2 = Json::Value::removeMember
                    (&root,binary._M_dataplus._M_p,binary._M_dataplus._M_p + binary._M_string_length
                     ,&removed);
  if (bVar2) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x694,"!did");
  }
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  std::__cxx11::string::string((string *)&local_f8,"there",(allocator *)&local_60);
  Json::Value::asString_abi_cxx11_(&local_118,&removed);
  JsonTest::checkStringEqual
            (pTVar1,(string *)&local_f8,&local_118,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x695,"\"there\" == removed.asString()");
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_f8);
  bVar2 = Json::Value::isMember(&root,&binary);
  if (bVar2) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x696,"!root.isMember(binary)");
  }
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  std::__cxx11::string::string((string *)&local_118,"",&local_119);
  Json::Value::get(&local_f8,&root,&binary,(Value *)Json::kNull);
  Json::Value::asString_abi_cxx11_(&local_60,&local_f8);
  JsonTest::checkStringEqual
            (pTVar1,&local_118,&local_60,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x697,"\"\" == root.get(binary, Json::Value::nullRef).asString()");
  std::__cxx11::string::~string((string *)&local_60);
  Json::Value::~Value(&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  Json::Value::~Value(&removed);
  Json::Value::~Value(&root);
  std::__cxx11::string::~string((string *)&binary);
  return;
}

Assistant:

JSONTEST_FIXTURE(ValueTest, zeroesInKeys) {
  char const cstr[] = "h\0i";
  std::string binary(cstr, sizeof(cstr));  // include trailing 0
  JSONTEST_ASSERT_EQUAL(4U, binary.length());
  {
    Json::Value root;
    root[binary] = "there";
    JSONTEST_ASSERT_STRING_EQUAL("there", root[binary].asString());
    JSONTEST_ASSERT(!root.isMember("h"));
    JSONTEST_ASSERT(root.isMember(binary));
    JSONTEST_ASSERT_STRING_EQUAL("there", root.get(binary, Json::Value::nullRef).asString());
    Json::Value removed;
    bool did;
    did = root.removeMember(binary.data(), binary.data() + binary.length(),
        &removed);
    JSONTEST_ASSERT(did);
    JSONTEST_ASSERT_STRING_EQUAL("there", removed.asString());
    did = root.removeMember(binary.data(), binary.data() + binary.length(),
        &removed);
    JSONTEST_ASSERT(!did);
    JSONTEST_ASSERT_STRING_EQUAL("there", removed.asString()); // still
    JSONTEST_ASSERT(!root.isMember(binary));
    JSONTEST_ASSERT_STRING_EQUAL("", root.get(binary, Json::Value::nullRef).asString());
  }
}